

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O1

int libwebvtt::Parser::ParseSettings(string *line,size_type idx,settings_t *settings)

{
  byte bVar1;
  _List_node_base *p_Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char cVar8;
  Setting local_78;
  
  std::__cxx11::_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::_M_clear
            (&settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>);
  (settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)settings;
  (settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)settings;
  (settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>)._M_impl.
  _M_node._M_size = 0;
  uVar4 = 0xffffffff;
  uVar5 = 0xffffffff;
  if ((idx != 0xffffffffffffffff) && (idx < line->_M_string_length)) {
    do {
      paVar7 = &local_78.value.field_2;
      paVar6 = &local_78.name.field_2;
      do {
        bVar1 = (line->_M_dataplus)._M_p[idx];
        uVar5 = (uint)bVar1;
        if (bVar1 == 0) {
          iVar3 = 1;
        }
        else if ((uVar5 == 0x20) || (uVar5 == 9)) {
          idx = idx + 1;
          iVar3 = 0;
          uVar5 = uVar4;
        }
        else {
          iVar3 = 4;
          uVar5 = uVar4;
        }
        uVar4 = uVar5;
      } while (iVar3 == 0);
      if (iVar3 == 1) {
        return uVar5;
      }
      local_78.name.field_2._8_8_ = 0;
      local_78.value.field_2._8_8_ = 0;
      local_78.name._M_string_length = 0;
      local_78.name.field_2._M_allocated_capacity = 0;
      local_78.value._M_string_length = 0;
      local_78.value.field_2._M_allocated_capacity = 0;
      local_78.name._M_dataplus._M_p = (pointer)paVar6;
      local_78.value._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::
      _M_insert<libwebvtt::Setting>(settings,(iterator)settings,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.value._M_dataplus._M_p != paVar7) {
        operator_delete(local_78.value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.name._M_dataplus._M_p != paVar6) {
        operator_delete(local_78.name._M_dataplus._M_p);
      }
      p_Var2 = (settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>)
               ._M_impl._M_node.super__List_node_base._M_prev;
      do {
        bVar1 = (line->_M_dataplus)._M_p[idx];
        if (bVar1 < 0x20) {
          if ((bVar1 == 0) || (bVar1 == 9)) {
LAB_0011788b:
            uVar5 = 0xffffffff;
            cVar8 = '\x01';
          }
          else {
LAB_00117879:
            std::__cxx11::string::push_back((char)p_Var2 + '\x10');
            idx = idx + 1;
            cVar8 = '\0';
          }
        }
        else {
          if (bVar1 == 0x20) goto LAB_0011788b;
          cVar8 = '\x06';
          if (bVar1 != 0x3a) goto LAB_00117879;
        }
      } while (cVar8 == '\0');
      if (cVar8 == '\x06') {
        if (p_Var2[1]._M_prev == (_List_node_base *)0x0) {
          uVar5 = 0xffffffff;
          cVar8 = '\x01';
        }
        else {
          idx = idx + 1;
          do {
            bVar1 = (line->_M_dataplus)._M_p[idx];
            cVar8 = '\b';
            if (bVar1 < 0x20) {
              if ((bVar1 != 0) && (bVar1 != 9)) {
LAB_001178e7:
                std::__cxx11::string::push_back((char)p_Var2 + '0');
                idx = idx + 1;
                cVar8 = '\0';
              }
            }
            else if (bVar1 != 0x20) {
              if (bVar1 != 0x3a) goto LAB_001178e7;
              uVar5 = 0xffffffff;
              cVar8 = '\x01';
            }
          } while (cVar8 == '\0');
          if (cVar8 == '\b') {
            cVar8 = p_Var2[3]._M_prev == (_List_node_base *)0x0;
            uVar5 = uVar5 | -(uint)(p_Var2[3]._M_prev == (_List_node_base *)0x0);
          }
        }
      }
      uVar4 = uVar5;
    } while (cVar8 == '\0');
  }
  return uVar5;
}

Assistant:

int Parser::ParseSettings(const std::string& line, std::string::size_type idx,
                          Cue::settings_t* settings) {
  settings->clear();

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  for (;;) {
    // We must parse a line comprising a sequence of 0 or more
    // NAME:VALUE pairs, separated by whitespace.  The line iself is
    // terminated with a NUL char (indicating end-of-line).

    for (;;) {
      const char c = line[idx];

      if (c == kNUL)  // end-of-line
        return 0;  // success

      if (c != kSPACE && c != kTAB)
        break;

      ++idx;  // consume whitespace
    }

    // We have consumed the whitespace, and have not yet reached
    // end-of-line, so there is something on the line for us to parse.

    settings->push_back(Setting());
    Setting& s = settings->back();

    // Parse the NAME part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == ':')  // we have reached end of NAME part
        break;

      if (c == kNUL || c == kSPACE || c == kTAB)
        return -1;

      s.name.push_back(c);

      ++idx;
    }

    if (s.name.empty())
      return -1;

    ++idx;  // consume colon

    // Parse the VALUE part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == kNUL || c == kSPACE || c == kTAB)
        break;

      if (c == ':')  // suspicious when part of VALUE
        return -1;  // TODO(matthewjheaney): verify this behavior

      s.value.push_back(c);

      ++idx;
    }

    if (s.value.empty())
      return -1;
  }
}